

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_connecter_base.cpp
# Opt level: O1

void __thiscall
zmq::stream_connecter_base_t::stream_connecter_base_t
          (stream_connecter_base_t *this,io_thread_t *io_thread_,session_base_t *session_,
          options_t *options_,address_t *addr_,bool delayed_start_)

{
  socket_base_t *psVar1;
  
  own_t::own_t(&this->super_own_t,io_thread_,options_);
  io_object_t::io_object_t(&this->super_io_object_t,io_thread_);
  (this->super_own_t).super_object_t._vptr_object_t =
       (_func_int **)&PTR__stream_connecter_base_t_001ecbf8;
  (this->super_io_object_t).super_i_poll_events._vptr_i_poll_events = (_func_int **)&DAT_001ecce8;
  this->_addr = addr_;
  this->_s = -1;
  this->_handle = (handle_t)0x0;
  (this->_endpoint)._M_dataplus._M_p = (pointer)&(this->_endpoint).field_2;
  (this->_endpoint)._M_string_length = 0;
  (this->_endpoint).field_2._M_local_buf[0] = '\0';
  psVar1 = session_base_t::get_socket(session_);
  this->_socket = psVar1;
  this->_delayed_start = delayed_start_;
  this->_reconnect_timer_started = false;
  this->_current_reconnect_ivl = (this->super_own_t).options.reconnect_ivl;
  this->_session = session_;
  if (this->_addr == (address_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_addr",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_connecter_base.cpp"
            ,0x3f);
    fflush(_stderr);
    zmq_abort("_addr");
  }
  address_t::to_string(this->_addr,&this->_endpoint);
  return;
}

Assistant:

zmq::stream_connecter_base_t::stream_connecter_base_t (
  zmq::io_thread_t *io_thread_,
  zmq::session_base_t *session_,
  const zmq::options_t &options_,
  zmq::address_t *addr_,
  bool delayed_start_) :
    own_t (io_thread_, options_),
    io_object_t (io_thread_),
    _addr (addr_),
    _s (retired_fd),
    _handle (static_cast<handle_t> (NULL)),
    _socket (session_->get_socket ()),
    _delayed_start (delayed_start_),
    _reconnect_timer_started (false),
    _current_reconnect_ivl (options.reconnect_ivl),
    _session (session_)
{
    zmq_assert (_addr);
    _addr->to_string (_endpoint);
    // TODO the return value is unused! what if it fails? if this is impossible
    // or does not matter, change such that endpoint in initialized using an
    // initializer, and make endpoint const
}